

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crop_x86.cpp
# Opt level: O0

void ncnn::crop_pack4_sse(Mat *src,Mat *dst,int top,int left)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined8 uVar5;
  __m128 _p;
  int x;
  int y;
  float *outptr;
  float *ptr;
  int right;
  int h;
  int w;
  int left_local;
  int top_local;
  Mat *dst_local;
  Mat *src_local;
  
  iVar1 = dst->w;
  iVar2 = dst->h;
  iVar3 = src->w;
  iVar4 = dst->w;
  outptr = (float *)((long)src->data +
                    (long)(left << 2) * 4 + (long)src->w * (long)top * src->elemsize);
  _x = (undefined8 *)dst->data;
  for (_p[3] = 0.0; (int)_p[3] < iVar2; _p[3] = (float)((int)_p[3] + 1)) {
    for (_p[2] = 0.0; (int)_p[2] < iVar1; _p[2] = (float)((int)_p[2] + 1)) {
      uVar5 = *(undefined8 *)(outptr + 2);
      *_x = *(undefined8 *)outptr;
      _x[1] = uVar5;
      outptr = outptr + 4;
      _x = _x + 2;
    }
    outptr = outptr + (iVar3 - iVar4) * 4;
  }
  return;
}

Assistant:

static void crop_pack4_sse(const Mat& src, Mat& dst, int top, int left)
{
    int w = dst.w;
    int h = dst.h;
    int right = src.w - dst.w - left;

    const float* ptr = src.row(top) + left * 4;
    float* outptr = dst;

    for (int y = 0; y < h; y++)
    {
        for (int x = 0; x < w; x++)
        {
            __m128 _p = _mm_loadu_ps(ptr);
            _mm_storeu_ps(outptr, _p);
            ptr += 4;
            outptr += 4;
        }

        ptr += (left + right) * 4;
    }
}